

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar32 c,uint16_t norm16,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  ushort uVar1;
  UBool UVar2;
  uint8_t cc;
  int32_t iVar3;
  uint16_t *puVar4;
  uint8_t local_49;
  uint8_t trailCC;
  uint8_t leadCC;
  int32_t length;
  uint16_t firstUnit;
  uint16_t *mapping;
  UErrorCode *pUStack_30;
  UChar jamos [3];
  UErrorCode *errorCode_local;
  ReorderingBuffer *buffer_local;
  uint16_t norm16_local;
  UChar32 c_local;
  Normalizer2Impl *this_local;
  
  pUStack_30 = errorCode;
  buffer_local._2_2_ = norm16;
  buffer_local._4_4_ = c;
  if (this->limitNoNo <= norm16) {
    UVar2 = isMaybeOrNonZeroCC(this,norm16);
    if (UVar2 != '\0') {
      cc = getCCFromYesOrMaybe(norm16);
      UVar2 = ReorderingBuffer::append(buffer,c,cc,pUStack_30);
      return UVar2;
    }
    buffer_local._4_4_ = mapAlgorithmic(this,c,norm16);
    buffer_local._2_2_ = getRawNorm16(this,buffer_local._4_4_);
  }
  if (buffer_local._2_2_ < this->minYesNo) {
    this_local._7_1_ = ReorderingBuffer::append(buffer,buffer_local._4_4_,'\0',pUStack_30);
  }
  else {
    UVar2 = isHangulLV(this,buffer_local._2_2_);
    if ((UVar2 == '\0') && (UVar2 = isHangulLVT(this,buffer_local._2_2_), UVar2 == '\0')) {
      puVar4 = getMapping(this,buffer_local._2_2_);
      uVar1 = *puVar4;
      if ((uVar1 & 0x80) == 0) {
        local_49 = '\0';
      }
      else {
        local_49 = (uint8_t)(puVar4[-1] >> 8);
      }
      UVar2 = ReorderingBuffer::append
                        (buffer,(UChar *)(puVar4 + 1),uVar1 & 0x1f,'\x01',local_49,
                         (uint8_t)(uVar1 >> 8),pUStack_30);
      return UVar2;
    }
    iVar3 = Hangul::decompose(buffer_local._4_4_,(UChar *)((long)&mapping + 2));
    this_local._7_1_ =
         ReorderingBuffer::appendZeroCC
                   (buffer,(UChar *)((long)&mapping + 2),
                    (UChar *)((long)&mapping + (long)iVar3 * 2 + 2),pUStack_30);
  }
  return this_local._7_1_;
}

Assistant:

UBool Normalizer2Impl::decompose(UChar32 c, uint16_t norm16,
                                 ReorderingBuffer &buffer,
                                 UErrorCode &errorCode) const {
    // get the decomposition and the lead and trail cc's
    if (norm16 >= limitNoNo) {
        if (isMaybeOrNonZeroCC(norm16)) {
            return buffer.append(c, getCCFromYesOrMaybe(norm16), errorCode);
        }
        // Maps to an isCompYesAndZeroCC.
        c=mapAlgorithmic(c, norm16);
        norm16=getRawNorm16(c);
    }
    if (norm16 < minYesNo) {
        // c does not decompose
        return buffer.append(c, 0, errorCode);
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        UChar jamos[3];
        return buffer.appendZeroCC(jamos, jamos+Hangul::decompose(c, jamos), errorCode);
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t length=firstUnit&MAPPING_LENGTH_MASK;
    uint8_t leadCC, trailCC;
    trailCC=(uint8_t)(firstUnit>>8);
    if(firstUnit&MAPPING_HAS_CCC_LCCC_WORD) {
        leadCC=(uint8_t)(*(mapping-1)>>8);
    } else {
        leadCC=0;
    }
    return buffer.append((const UChar *)mapping+1, length, TRUE, leadCC, trailCC, errorCode);
}